

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> __thiscall
bloaty::MmapInputFileFactory::OpenFile(MmapInputFileFactory *this,string *filename)

{
  bool bVar1;
  undefined8 *in_RDX;
  pointer *__ptr;
  string_view filename_00;
  
  (this->super_InputFileFactory)._vptr_InputFileFactory = (_func_int **)0x0;
  filename_00._M_str = (char *)*in_RDX;
  filename_00._M_len = in_RDX[1];
  bVar1 = MmapInputFile::DoTryOpen
                    (filename_00,
                     (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)this)
  ;
  if (bVar1) {
    return (__uniq_ptr_data<bloaty::InputFile,_std::default_delete<bloaty::InputFile>,_true,_true>)
           (__uniq_ptr_data<bloaty::InputFile,_std::default_delete<bloaty::InputFile>,_true,_true>)
           this;
  }
  Throw("Failed to open file.",0x3cf);
}

Assistant:

std::unique_ptr<InputFile> MmapInputFileFactory::OpenFile(
    const std::string& filename) const {
  std::unique_ptr<InputFile> ret;
  if (!MmapInputFile::DoTryOpen(filename, ret)) {
    THROW("Failed to open file.");
  }
  return ret;
}